

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O3

Vec_Int_t * Pdr_InvCounts(Vec_Int_t *vInv)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *__s;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  
  if ((long)vInv->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  piVar2 = vInv->pArray;
  iVar1 = piVar2[(long)vInv->nSize + -1];
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar3 = iVar1;
  }
  pVVar4->nCap = iVar3;
  if (iVar3 == 0) {
    pVVar4->pArray = (int *)0x0;
    pVVar4->nSize = iVar1;
  }
  else {
    __s = (int *)malloc((long)iVar3 << 2);
    pVVar4->pArray = __s;
    pVVar4->nSize = iVar1;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)iVar1 << 2);
      goto LAB_005f187a;
    }
  }
  __s = (int *)0x0;
LAB_005f187a:
  iVar3 = *piVar2;
  if (0 < iVar3) {
    iVar5 = 0;
    do {
      uVar6 = (ulong)piVar2[1];
      if (0 < (long)uVar6) {
        uVar7 = 0;
        do {
          if (piVar2[uVar7 + 2] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar8 = (uint)piVar2[uVar7 + 2] >> 1;
          if (iVar1 <= (int)uVar8) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          uVar7 = uVar7 + 1;
          __s[uVar8] = __s[uVar8] + 1;
        } while (uVar7 < uVar6);
      }
      iVar5 = iVar5 + 1;
      piVar2 = piVar2 + 1 + uVar6;
    } while (iVar5 < iVar3);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Pdr_InvCounts( Vec_Int_t * vInv )
{
    int i, k, * pCube, * pList = Vec_IntArray(vInv);
    Vec_Int_t * vCounts = Vec_IntStart( Vec_IntEntryLast(vInv) );
    Pdr_ForEachCube( pList, pCube, i )
        for ( k = 0; k < pCube[0]; k++ )
            Vec_IntAddToEntry( vCounts, Abc_Lit2Var(pCube[k+1]), 1 );
    return vCounts;
}